

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Type::addArrayElements(Type *this,Type *elementType,uint32_t numElementsToAdd)

{
  Content *this_00;
  uint32_t uVar1;
  bool bVar2;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this_01;
  undefined1 local_98 [8];
  Type local_90;
  Type local_70;
  Type local_50;
  
  if (elementType->mainType == void_) {
    throwError("Element type cannot be void");
  }
  if (this->mainType == primitiveArray) {
    this_00 = &this->content;
    PrimitiveArray::getElementType((Type *)local_98,&this_00->primitiveArray);
    bVar2 = operator==(elementType,(Type *)local_98);
    deleteAllocatedObjects((Type *)local_98);
    uVar1 = (this->content).vector.numElements;
    if (bVar2) {
      (this->content).vector.numElements = uVar1 + numElementsToAdd;
      return;
    }
    if (uVar1 == 0) {
      local_50.mainType = elementType->mainType;
      local_50.content.object = (elementType->content).object;
      local_50.content._8_8_ = *(undefined8 *)((long)&elementType->content + 8);
      local_50.allocator = elementType->allocator;
      elementType->mainType = void_;
      createArray((Type *)local_98,&local_50,numElementsToAdd,this->allocator);
      operator=(this,(Type *)local_98);
      deleteAllocatedObjects((Type *)local_98);
      deleteAllocatedObjects(&local_50);
      return;
    }
    this->mainType = complexArray;
    this_01 = &(anonymous_namespace)::
               allocateObject<choc::value::Type::ComplexArray,choc::value::Allocator*&>
                         (this->allocator,&this->allocator)->groups;
    uVar1 = (this->content).vector.numElements;
    PrimitiveArray::getElementType(&local_70,&this_00->primitiveArray);
    local_90.mainType = local_70.mainType;
    local_90.content.object = local_70.content.object;
    local_90.content._8_8_ = local_70.content._8_8_;
    local_90.allocator = local_70.allocator;
    local_70.mainType = void_;
    local_98._0_4_ = uVar1;
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::push_back
              (this_01,(RepeatedGroup *)local_98);
    deleteAllocatedObjects(&local_90);
    deleteAllocatedObjects(&local_70);
    this_00->complexArray = (ComplexArray *)this_01;
  }
  else {
    if (this->mainType != complexArray) {
      throwError("Cannot add new elements to this type");
    }
    this_01 = &((this->content).complexArray)->groups;
  }
  ComplexArray::addElements((ComplexArray *)this_01,elementType,numElementsToAdd);
  return;
}

Assistant:

bool isType (Types... types) const noexcept   { return ((mainType == types) || ...); }